

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ma.c
# Opt level: O0

void list_coalesce(AD *list)

{
  _AD *p_Var1;
  AD *ad2;
  AD *ad1;
  AD *list_local;
  
  ad2 = list;
  while (ad2 != (AD *)0x0) {
    p_Var1 = (_AD *)(ad2->name + (ad2->nbytes - 0x10));
    if (p_Var1 == ad2->next) {
      ad2->nbytes = p_Var1->nbytes + ad2->nbytes;
      ad2->next = p_Var1->next;
    }
    else {
      ad2 = ad2->next;
    }
  }
  return;
}

Assistant:

private void list_coalesce(list)
    AD        *list;        /* the list to coalesce */
{
    AD        *ad1;        /* lead traversal pointer */
    AD        *ad2;        /* trailing traversal pointer */

    for (ad2 = list; ad2;)
    {
        /* compute first address beyond ad2 */
        ad1 = (AD *)((Pointer)ad2 + ad2->nbytes);

        /* are ad2 and ad1 contiguous? */
        if (ad1 == ad2->next)
        {
            /* yes; merge ad1 into ad2 */
            ad2->nbytes += ad1->nbytes;
            ad2->next = ad1->next;
        }
        else
        {
            /* no; advance ad2 */
            ad2 = ad2->next;
        }
    }
}